

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

Sign anon_unknown.dwarf_787a7::side4h_3d_exact_SOS
               (double *p0,double *p1,double *p2,double *p3,double *p4,double h0,double h1,double h2
               ,double h3,double h4,bool sos)

{
  double dVar1;
  double dVar2;
  double dVar3;
  index_t iVar4;
  index_t iVar5;
  index_t iVar6;
  double *pdVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  expansion *this;
  Sign SVar14;
  expansion *this_00;
  expansion *this_01;
  expansion *peVar15;
  expansion *this_02;
  double **begin;
  int iVar16;
  expansion *peVar17;
  ulong uVar18;
  int iVar19;
  expansion *this_03;
  expansion *this_04;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  double dVar23;
  double dStackY_930;
  expansion local_908 [64];
  expansion local_2f8;
  expansion local_2d8;
  expansion local_2b8;
  expansion local_298;
  expansion local_278;
  expansion local_258;
  expansion local_238;
  expansion local_218;
  expansion local_1f8;
  string local_1d8;
  expansion local_1b8;
  expansion local_198;
  expansion local_178;
  expansion local_158;
  expansion local_138;
  expansion local_118;
  expansion local_f8;
  undefined1 local_d8 [8];
  double *p_sort [5];
  
  dVar23 = *p1;
  dVar1 = *p0;
  local_2b8.length_ = 2;
  local_2b8.capacity_ = 2;
  local_2b8.x_[1] = dVar23 - dVar1;
  local_2b8.x_[0] =
       (dVar23 - (local_2b8.x_[1] + (dVar23 - local_2b8.x_[1]))) +
       ((dVar23 - local_2b8.x_[1]) - dVar1);
  dVar23 = p1[1];
  dVar2 = p0[1];
  local_298.length_ = 2;
  local_298.capacity_ = 2;
  local_298.x_[1] = dVar23 - dVar2;
  local_298.x_[0] =
       (dVar23 - (local_298.x_[1] + (dVar23 - local_298.x_[1]))) +
       ((dVar23 - local_298.x_[1]) - dVar2);
  dVar23 = p1[2];
  dVar3 = p0[2];
  local_1b8.length_ = 2;
  local_1b8.capacity_ = 2;
  local_1b8.x_[1] = dVar23 - dVar3;
  local_1b8.x_[0] =
       (dVar23 - (local_1b8.x_[1] + (dVar23 - local_1b8.x_[1]))) +
       ((dVar23 - local_1b8.x_[1]) - dVar3);
  local_198.length_ = 2;
  local_198.capacity_ = 2;
  local_198.x_[1] = h0 - h1;
  local_198.x_[0] =
       (h0 - (local_198.x_[1] + (h0 - local_198.x_[1]))) + ((h0 - local_198.x_[1]) - h1);
  dVar23 = *p2;
  local_2f8.length_ = 2;
  local_2f8.capacity_ = 2;
  local_2f8.x_[1] = dVar23 - dVar1;
  local_2f8.x_[0] =
       (dVar23 - (local_2f8.x_[1] + (dVar23 - local_2f8.x_[1]))) +
       ((dVar23 - local_2f8.x_[1]) - dVar1);
  dVar23 = p2[1];
  local_178.length_ = 2;
  local_178.capacity_ = 2;
  local_178.x_[1] = dVar23 - dVar2;
  local_178.x_[0] =
       (dVar23 - (local_178.x_[1] + (dVar23 - local_178.x_[1]))) +
       ((dVar23 - local_178.x_[1]) - dVar2);
  dVar23 = p2[2];
  local_278.length_ = 2;
  local_278.capacity_ = 2;
  local_278.x_[1] = dVar23 - dVar3;
  local_278.x_[0] =
       (dVar23 - (local_278.x_[1] + (dVar23 - local_278.x_[1]))) +
       ((dVar23 - local_278.x_[1]) - dVar3);
  local_158.length_ = 2;
  local_158.capacity_ = 2;
  local_158.x_[1] = h0 - h2;
  local_158.x_[0] =
       (h0 - (local_158.x_[1] + (h0 - local_158.x_[1]))) + ((h0 - local_158.x_[1]) - h2);
  dVar23 = *p3;
  local_138.length_ = 2;
  local_138.capacity_ = 2;
  local_138.x_[1] = dVar23 - dVar1;
  local_138.x_[0] =
       (dVar23 - (local_138.x_[1] + (dVar23 - local_138.x_[1]))) +
       ((dVar23 - local_138.x_[1]) - dVar1);
  dVar23 = p3[1];
  local_258.length_ = 2;
  local_258.capacity_ = 2;
  local_258.x_[1] = dVar23 - dVar2;
  local_258.x_[0] =
       (dVar23 - (local_258.x_[1] + (dVar23 - local_258.x_[1]))) +
       ((dVar23 - local_258.x_[1]) - dVar2);
  dVar23 = p3[2];
  local_238.length_ = 2;
  local_238.capacity_ = 2;
  local_238.x_[1] = dVar23 - dVar3;
  local_238.x_[0] =
       (dVar23 - (local_238.x_[1] + (dVar23 - local_238.x_[1]))) +
       ((dVar23 - local_238.x_[1]) - dVar3);
  local_118.length_ = 2;
  local_118.capacity_ = 2;
  local_118.x_[1] = h0 - h3;
  local_118.x_[0] =
       (h0 - (local_118.x_[1] + (h0 - local_118.x_[1]))) + ((h0 - local_118.x_[1]) - h3);
  dVar23 = *p4;
  local_2d8.length_ = 2;
  local_2d8.capacity_ = 2;
  local_2d8.x_[1] = dVar23 - dVar1;
  local_2d8.x_[0] =
       (dVar23 - (local_2d8.x_[1] + (dVar23 - local_2d8.x_[1]))) +
       ((dVar23 - local_2d8.x_[1]) - dVar1);
  dVar23 = p4[1];
  local_218.length_ = 2;
  local_218.capacity_ = 2;
  local_218.x_[1] = dVar23 - dVar2;
  local_218.x_[0] =
       (dVar23 - (local_218.x_[1] + (dVar23 - local_218.x_[1]))) +
       ((dVar23 - local_218.x_[1]) - dVar2);
  dVar23 = p4[2];
  local_1f8.length_ = 2;
  local_1f8.capacity_ = 2;
  local_f8.length_ = 2;
  local_f8.capacity_ = 2;
  local_908[0].length_ = 0;
  local_908[0].capacity_ = 0xc0;
  local_1f8.x_[1] = dVar23 - dVar3;
  local_1f8.x_[0] =
       (dVar23 - (local_1f8.x_[1] + (dVar23 - local_1f8.x_[1]))) +
       ((dVar23 - local_1f8.x_[1]) - dVar3);
  local_f8.x_[1] = h0 - h4;
  local_f8.x_[0] = (h0 - (local_f8.x_[1] + (h0 - local_f8.x_[1]))) + ((h0 - local_f8.x_[1]) - h4);
  dStackY_930 = 6.73083909758426e-318;
  GEO::expansion::assign_det3x3
            (local_908,&local_2f8,&local_178,&local_278,&local_138,&local_258,&local_238,&local_2d8,
             &local_218,&local_1f8);
  uVar9 = ((local_218.length_ + local_1f8.length_) * local_138.length_ +
           local_238.length_ * local_218.length_ + local_1f8.length_ * local_258.length_ +
          (local_238.length_ + local_258.length_) * local_2d8.length_) * 8;
  uVar13 = (ulong)uVar9 * 8 + 0x10 & 0x7ffffffd0;
  lVar8 = -uVar13;
  this_00 = (expansion *)((long)local_908 + lVar8);
  *(undefined4 *)((long)local_908 - uVar13) = 0;
  *(uint *)((long)local_908 + lVar8 + 4) = uVar9;
  *(expansion **)((long)local_908 + lVar8 + -8) = &local_1f8;
  *(expansion **)((long)local_908 + lVar8 + -0x10) = &local_218;
  *(expansion **)((long)local_908 + lVar8 + -0x18) = &local_2d8;
  *(expansion **)(&stack0xfffffffffffff6d8 + lVar8) = &local_238;
  *(undefined8 *)((long)&dStackY_930 + lVar8) = 0x14ca44;
  GEO::expansion::assign_det3x3
            (this_00,&local_2b8,&local_298,&local_1b8,&local_138,&local_258,
             *(expansion **)(&stack0xfffffffffffff6d8 + lVar8),
             *(expansion **)((long)local_908 + lVar8 + -0x18),
             *(expansion **)((long)local_908 + lVar8 + -0x10),
             *(expansion **)((long)local_908 + lVar8 + -8));
  uVar9 = ((local_2d8.length_ * local_178.length_ + local_2f8.length_ * local_218.length_) *
           local_1b8.length_ +
          (local_278.length_ * local_2d8.length_ + local_1f8.length_ * local_2f8.length_) *
          local_298.length_ +
          (local_278.length_ * local_218.length_ + local_1f8.length_ * local_178.length_) *
          local_2b8.length_) * 4;
  uVar13 = (ulong)uVar9 * 8 + 0x10 & 0x7fffffff0;
  this_01 = (expansion *)((long)local_908 + (lVar8 - uVar13));
  *(undefined4 *)((long)local_908 + (lVar8 - uVar13)) = 0;
  this_01->capacity_ = uVar9;
  this_01[-1].x_[1] = (double)&local_1f8;
  this_01[-1].x_[0] = (double)&local_218;
  *(expansion **)(this_01 + -1) = &local_2d8;
  this_01[-2].x_[1] = (double)&local_278;
  this_01[-2].x_[0] = 6.73265725916096e-318;
  GEO::expansion::assign_det3x3
            (this_01,&local_2b8,&local_298,&local_1b8,&local_2f8,&local_178,
             (expansion *)this_01[-2].x_[1],*(expansion **)(this_01 + -1),
             (expansion *)this_01[-1].x_[0],(expansion *)this_01[-1].x_[1]);
  uVar9 = ((local_138.length_ * local_178.length_ + local_2f8.length_ * local_258.length_) *
           local_1b8.length_ +
          (local_278.length_ * local_138.length_ + local_238.length_ * local_2f8.length_) *
          local_298.length_ +
          (local_278.length_ * local_258.length_ + local_238.length_ * local_178.length_) *
          local_2b8.length_) * 4;
  uVar13 = (ulong)uVar9 * 8 + 0x10 & 0x7fffffff0;
  this_03 = (expansion *)((long)this_01 - uVar13);
  this_03->length_ = 0;
  this_03->capacity_ = uVar9;
  this_03[-1].x_[1] = (double)&local_238;
  this_03[-1].x_[0] = (double)&local_258;
  *(expansion **)(this_03 + -1) = &local_138;
  this_03[-2].x_[1] = (double)&local_278;
  this_03[-2].x_[0] = 6.73362068717035e-318;
  GEO::expansion::assign_det3x3
            (this_03,&local_2b8,&local_298,&local_1b8,&local_2f8,&local_178,
             (expansion *)this_03[-2].x_[1],*(expansion **)(this_03 + -1),
             (expansion *)this_03[-1].x_[0],(expansion *)this_03[-1].x_[1]);
  iVar19 = *(int *)((long)this_01 - uVar13);
  iVar16 = 0;
  if (iVar19 != 0) {
    iVar16 = 1;
    if (this_03->x_[iVar19 - 1] <= 0.0) {
      iVar16 = -(uint)(this_03->x_[iVar19 - 1] < 0.0);
    }
  }
  if (iVar16 == 0) {
    local_d8 = (undefined1  [8])(p_sort + 1);
    this_03[-1].x_[1] = 6.74001883728399e-318;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"Delta4_sign != ZERO","");
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    this_03[-1].x_[1] = 6.74020164157295e-318;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
               ,"");
    this_03[-1].x_[1] = (double)&LAB_0014d120;
    GEO::geo_assertion_failed((string *)local_d8,&local_1d8,0x5007);
  }
  uVar9 = local_908[0].length_ << 2;
  uVar13 = (ulong)uVar9 * 8 + 0x10 & 0x7fffffff0;
  peVar15 = (expansion *)((long)this_03 - uVar13);
  *(undefined4 *)((long)this_03 - uVar13) = 0;
  peVar15->capacity_ = uVar9;
  peVar15[-1].x_[1] = 6.7343272010439e-318;
  GEO::expansion::assign_product(peVar15,local_908,&local_198);
  uVar9 = this_00->length_ << 2;
  uVar13 = (ulong)uVar9 * 8 + 0x10 & 0x7fffffff0;
  peVar17 = (expansion *)((long)peVar15 - uVar13);
  peVar17->length_ = 0;
  peVar17->capacity_ = uVar9;
  peVar17[-1].x_[1] = 6.73461375911849e-318;
  GEO::expansion::assign_product(peVar17,this_00,&local_158);
  uVar9 = *(uint *)((long)peVar15 - uVar13);
  if ((ulong)uVar9 != 0) {
    uVar13 = 0;
    do {
      peVar17->x_[uVar13] = -peVar17->x_[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar9 != uVar13);
  }
  uVar10 = this_01->length_ << 2;
  uVar13 = (ulong)uVar10 * 8 + 0x10 & 0x7fffffff0;
  this_02 = (expansion *)((long)peVar17 - uVar13);
  *(undefined4 *)((long)peVar17 - uVar13) = 0;
  this_02->capacity_ = uVar10;
  this_02[-1].x_[1] = 6.73518687526767e-318;
  GEO::expansion::assign_product(this_02,this_01,&local_118);
  uVar13 = (ulong)(uint)(iVar19 << 2) * 8 + 0x10 & 0x7fffffff0;
  this = (expansion *)((long)this_02 - uVar13);
  this->length_ = 0;
  this->capacity_ = iVar19 << 2;
  this[-1].x_[1] = 6.73547837399871e-318;
  GEO::expansion::assign_product(this,this_03,&local_f8);
  uVar10 = *(uint *)((long)this_02 - uVar13);
  if ((ulong)uVar10 != 0) {
    uVar13 = 0;
    do {
      this->x_[uVar13] = -this->x_[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar10 != uVar13);
  }
  iVar4 = this_02->length_;
  iVar19 = uVar9 + uVar10 + peVar15->length_;
  uVar13 = (ulong)(iVar4 + iVar19 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  this_04 = (expansion *)((long)this - uVar13);
  this_04->length_ = 0;
  this_04->capacity_ = iVar19 + iVar4;
  this_04[-1].x_[1] = 6.73607125277372e-318;
  GEO::expansion::assign_sum(this_04,peVar15,peVar17,this_02,this);
  iVar19 = *(int *)((long)this - uVar13);
  if (iVar19 == 0) {
    iVar12 = 0;
  }
  else {
    iVar12 = 1;
    if (this_04->x_[iVar19 - 1] <= 0.0) {
      iVar12 = -(uint)(this_04->x_[iVar19 - 1] < 0.0);
    }
  }
  if (sos && iVar12 == 0) {
    begin = (double **)local_d8;
    local_d8 = (undefined1  [8])p0;
    p_sort[0] = p1;
    p_sort[1] = p2;
    p_sort[2] = p3;
    p_sort[3] = p4;
    this_04[-1].x_[1] = 6.73678764796019e-318;
    SOS_sort(begin,p_sort + 4,3);
    iVar4 = local_908[0].length_;
    uVar9 = local_908[0].length_ - 1;
    uVar13 = 0;
    bVar21 = false;
    do {
      pdVar7 = p_sort[uVar13 - 1];
      if (pdVar7 == p0) {
        iVar5 = this_00->length_;
        uVar20 = (ulong)(iVar5 + iVar4 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
        peVar15 = (expansion *)((long)this_04 - uVar20);
        peVar15->length_ = 0;
        peVar15->capacity_ = iVar4 + iVar5;
        peVar15[-1].x_[1] = 6.73765226284041e-318;
        GEO::expansion::assign_diff(peVar15,this_00,local_908);
        iVar5 = this_03->length_;
        iVar6 = this_01->length_;
        uVar18 = (ulong)(iVar5 + iVar6 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
        peVar17 = (expansion *)((long)peVar15 - uVar18);
        peVar17->length_ = 0;
        peVar17->capacity_ = iVar6 + iVar5;
        peVar17[-1].x_[1] = 6.73796846485375e-318;
        GEO::expansion::assign_diff(peVar17,this_03,this_01);
        iVar19 = *(int *)((long)this_04 - uVar20);
        iVar11 = *(int *)((long)peVar15 - uVar18);
        uVar18 = (ulong)(iVar19 + iVar11 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
        this_04 = (expansion *)((long)peVar17 - uVar18);
        this_04->length_ = 0;
        this_04->capacity_ = iVar11 + iVar19;
        this_04[-1].x_[1] = 6.73832419211876e-318;
        GEO::expansion::assign_sum(this_04,peVar15,peVar17);
        iVar11 = 0;
        iVar19 = *(int *)((long)peVar17 - uVar18);
        if (iVar19 != 0) {
          iVar11 = 1;
          if (this_04->x_[iVar19 - 1] <= 0.0) {
            iVar11 = -(uint)(this_04->x_[iVar19 - 1] < 0.0);
          }
        }
        bVar22 = iVar11 != 0;
        SVar14 = (Sign)begin;
        if (bVar22) {
          SVar14 = iVar11 * iVar16;
        }
        begin = (double **)(ulong)(uint)SVar14;
joined_r0x0014cfe4:
        if (bVar22) break;
      }
      else {
        if (pdVar7 == p1) {
          if (iVar4 == 0) {
LAB_0014d063:
            iVar19 = 0;
          }
          else {
            dVar23 = local_908[0].x_[uVar9];
LAB_0014d046:
            iVar19 = -(uint)(dVar23 < 0.0);
            if (0.0 < dVar23) {
              iVar19 = 1;
            }
          }
          uVar10 = iVar19 * iVar16;
LAB_0014d077:
          bVar22 = iVar19 != 0;
          begin = (double **)((ulong)begin & 0xffffffff);
          if (bVar22) {
            begin = (double **)(ulong)uVar10;
          }
          SVar14 = (Sign)begin;
          goto joined_r0x0014cfe4;
        }
        if (pdVar7 == p2) {
          if (this_00->length_ == 0) {
            iVar19 = 0;
          }
          else {
            dVar23 = *(double *)((long)local_908 + (ulong)(this_00->length_ - 1) * 8 + lVar8 + 8);
            iVar19 = -(uint)(dVar23 < 0.0);
            if (0.0 < dVar23) {
              iVar19 = 1;
            }
          }
          uVar10 = -(iVar16 * iVar19);
          goto LAB_0014d077;
        }
        if (pdVar7 == p3) {
          if (this_01->length_ == 0) goto LAB_0014d063;
          dVar23 = this_01->x_[this_01->length_ - 1];
          goto LAB_0014d046;
        }
        if (pdVar7 == p4) {
          SVar14 = NEGATIVE;
          break;
        }
      }
      SVar14 = (Sign)begin;
      bVar21 = 3 < uVar13;
      uVar13 = uVar13 + 1;
    } while (uVar13 != 5);
    if (!bVar21) {
      return SVar14;
    }
  }
  return iVar12 * iVar16;
}

Assistant:

Sign side4h_3d_exact_SOS(
        const double* p0, const double* p1,
        const double* p2, const double* p3, const double* p4,
        double h0, double h1, double h2, double h3, double h4,
        bool sos = true
    ) {
        PCK_STAT(cnt_orient3dh_exact++);

        const expansion& a11 = expansion_diff(p1[0], p0[0]);
        const expansion& a12 = expansion_diff(p1[1], p0[1]);
        const expansion& a13 = expansion_diff(p1[2], p0[2]);
        const expansion& a14 = expansion_diff(h0,h1);

        const expansion& a21 = expansion_diff(p2[0], p0[0]);
        const expansion& a22 = expansion_diff(p2[1], p0[1]);
        const expansion& a23 = expansion_diff(p2[2], p0[2]);
        const expansion& a24 = expansion_diff(h0,h2);

        const expansion& a31 = expansion_diff(p3[0], p0[0]);
        const expansion& a32 = expansion_diff(p3[1], p0[1]);
        const expansion& a33 = expansion_diff(p3[2], p0[2]);
        const expansion& a34 = expansion_diff(h0,h3);

        const expansion& a41 = expansion_diff(p4[0], p0[0]);
        const expansion& a42 = expansion_diff(p4[1], p0[1]);
        const expansion& a43 = expansion_diff(p4[2], p0[2]);
        const expansion& a44 = expansion_diff(h0,h4);

        // Note: we could probably reuse some of the 2x2 co-factors
        // (but for now I'd rather keep this form that is easier to
        //  read ... and to debug if need be !)
        const expansion& Delta1 = expansion_det3x3(
            a21, a22, a23,
            a31, a32, a33,
            a41, a42, a43
        );
        const expansion& Delta2 = expansion_det3x3(
            a11, a12, a13,
            a31, a32, a33,
            a41, a42, a43
        );
        const expansion& Delta3 = expansion_det3x3(
            a11, a12, a13,
            a21, a22, a23,
            a41, a42, a43
        );
        const expansion& Delta4 = expansion_det3x3(
            a11, a12, a13,
            a21, a22, a23,
            a31, a32, a33
        );

        Sign Delta4_sign = Delta4.sign();
        geo_assert(Delta4_sign != ZERO);

        const expansion& r_1 = expansion_product(Delta1, a14);
        const expansion& r_2 = expansion_product(Delta2, a24).negate();
        const expansion& r_3 = expansion_product(Delta3, a34);
        const expansion& r_4 = expansion_product(Delta4, a44).negate();
        const expansion& r = expansion_sum4(r_1, r_2, r_3, r_4);

        Sign r_sign = r.sign();

        // Statistics
        PCK_STAT(len_orient3dh_num = std::max(len_orient3dh_num, r.length()));
        PCK_STAT(len_orient3dh_denom = std::max(len_orient3dh_denom, Delta1.length()));

        // Simulation of Simplicity (symbolic perturbation)
        if(sos && r_sign == ZERO) {
            PCK_STAT(cnt_orient3dh_SOS++);
            const double* p_sort[5];
            p_sort[0] = p0;
            p_sort[1] = p1;
            p_sort[2] = p2;
            p_sort[3] = p3;
            p_sort[4] = p4;

	    SOS_sort(p_sort, p_sort + 5, 3);
            for(index_t i = 0; i < 5; ++i) {
                if(p_sort[i] == p0) {
                    const expansion& z1 = expansion_diff(Delta2, Delta1);
                    const expansion& z2 = expansion_diff(Delta4, Delta3);
                    const expansion& z = expansion_sum(z1, z2);
                    Sign z_sign = z.sign();
                    PCK_STAT(len_orient3dh_SOS = std::max(len_orient3dh_SOS, z.length()));
                    if(z_sign != ZERO) {
                        return Sign(Delta4_sign * z_sign);
                    }
                } else if(p_sort[i] == p1) {
                    Sign Delta1_sign = Delta1.sign();
                    if(Delta1_sign != ZERO) {
                        PCK_STAT(len_orient3dh_SOS = std::max(len_orient3dh_SOS, Delta1.length()));
                        return Sign(Delta4_sign * Delta1_sign);
                    }
                } else if(p_sort[i] == p2) {
                    Sign Delta2_sign = Delta2.sign();
                    if(Delta2_sign != ZERO) {
                        PCK_STAT(len_orient3dh_SOS = std::max(len_orient3dh_SOS, Delta2.length()));
                        return Sign(-Delta4_sign * Delta2_sign);
                    }
                } else if(p_sort[i] == p3) {
                    Sign Delta3_sign = Delta3.sign();
                    if(Delta3_sign != ZERO) {
                        PCK_STAT(len_orient3dh_SOS = std::max(len_orient3dh_SOS, Delta3.length()));
                        return Sign(Delta4_sign * Delta3_sign);
                    }
                } else if(p_sort[i] == p4) {
                    return NEGATIVE;
                }
            }
        }
        return Sign(Delta4_sign * r_sign);
    }